

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AttachedPart.cpp
# Opt level: O0

void __thiscall KDIS::DATA_TYPE::AttachedPart::Encode(AttachedPart *this,KDataStream *stream)

{
  KDataStream *pKVar1;
  KDataStream *stream_local;
  AttachedPart *this_local;
  
  pKVar1 = KDataStream::operator<<(stream,(this->super_VariableParameter).m_ui8VarParamType);
  pKVar1 = KDataStream::operator<<(pKVar1,this->m_ui8DetachedIndicator);
  pKVar1 = KDataStream::operator<<(pKVar1,this->m_ui16PartAttachedToID);
  pKVar1 = KDataStream::operator<<(pKVar1,this->m_ui32APPT);
  DATA_TYPE::operator<<(pKVar1,&(this->m_AttachedPartType).super_DataTypeBase);
  return;
}

Assistant:

void AttachedPart::Encode( KDataStream & stream ) const
{
    stream << m_ui8VarParamType
           << m_ui8DetachedIndicator
           << m_ui16PartAttachedToID
           << m_ui32APPT
           << KDIS_STREAM m_AttachedPartType;
}